

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O2

string * __thiscall
wallet::RecurseImportData_abi_cxx11_
          (string *__return_storage_ptr__,wallet *this,CScript *script,ImportData *import_data,
          ScriptContext script_ctx)

{
  long lVar1;
  pointer n;
  uchar *puVar2;
  string_view func;
  bool bVar3;
  TxoutType TVar4;
  mapped_type_conflict *pmVar5;
  UniValue *pUVar6;
  NonFatalCheckError *this_00;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ScriptContext script_ctx_00;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> vch_01;
  string_view msg;
  string_view file;
  type subscript;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solverdata;
  base_blob<160U> local_9c;
  CScriptID id;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  solverdata.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  solverdata.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  solverdata.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar4 = Solver((CScript *)this,&solverdata);
  iVar8 = (int)import_data;
  switch(TVar4) {
  case NONSTANDARD:
  case ANCHOR:
  case WITNESS_V1_TAPROOT:
  case WITNESS_UNKNOWN:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unrecognized script",(allocator<char> *)&id);
    break;
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              ((CPubKey *)&id,
               ((solverdata.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((solverdata.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    CPubKey::GetID((CKeyID *)&local_9c,(CPubKey *)&id);
    subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
    super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
    super__Head_base<0UL,_CScript_*,_false>._M_head_impl =
         (__uniq_ptr_data<CScript,_std::default_delete<CScript>,_true,_true>)
         ((ulong)subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
                 super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                 super__Head_base<0UL,_CScript_*,_false>._M_head_impl & 0xffffffffffffff00);
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
    ::_M_emplace_unique<CKeyID,bool>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
                *)(script + 2),(CKeyID *)&local_9c,(bool *)&subscript);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_9c);
    break;
  case PUBKEYHASH:
    puVar2 = ((solverdata.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch.m_size = (long)((solverdata.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2;
    vch.m_data = puVar2;
    base_blob<160U>::base_blob(&local_9c,vch);
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] =
         local_9c.m_data._M_elems[0x10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] =
         local_9c.m_data._M_elems[0x11];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] =
         local_9c.m_data._M_elems[0x12];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] =
         local_9c.m_data._M_elems[0x13];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0] =
         local_9c.m_data._M_elems[0];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1] =
         local_9c.m_data._M_elems[1];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2] =
         local_9c.m_data._M_elems[2];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3] =
         local_9c.m_data._M_elems[3];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4] =
         local_9c.m_data._M_elems[4];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5] =
         local_9c.m_data._M_elems[5];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6] =
         local_9c.m_data._M_elems[6];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7] =
         local_9c.m_data._M_elems[7];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] =
         local_9c.m_data._M_elems[8];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] =
         local_9c.m_data._M_elems[9];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] =
         local_9c.m_data._M_elems[10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] =
         local_9c.m_data._M_elems[0xb];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] =
         local_9c.m_data._M_elems[0xc];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] =
         local_9c.m_data._M_elems[0xd];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] =
         local_9c.m_data._M_elems[0xe];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] =
         local_9c.m_data._M_elems[0xf];
    pmVar5 = std::
             map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
             operator[]((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                         *)(script + 2),(key_type *)&id);
    *pmVar5 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_9c);
    break;
  case SCRIPTHASH:
    if (iVar8 == 2) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&id,"Trying to nest P2SH inside a P2WSH",(allocator<char> *)&local_9c);
      JSONRPCError(pUVar6,-5,(string *)&id);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_004e03d8;
    }
    if (iVar8 == 1) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&id,"Trying to nest P2SH inside another P2SH",
                 (allocator<char> *)&local_9c);
      JSONRPCError(pUVar6,-5,(string *)&id);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_004e03d8;
    }
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0] = iVar8 == 0;
    script_ctx_00 = 0x706ae0;
    inline_check_non_fatal<bool>
              ((bool *)&id,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp"
               ,0x368,"RecurseImportData","script_ctx == ScriptContext::TOP");
    puVar2 = ((solverdata.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch_00.m_size =
         (long)((solverdata.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar2;
    vch_00.m_data = puVar2;
    base_blob<160U>::base_blob(&local_9c,vch_00);
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] =
         local_9c.m_data._M_elems[0x10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] =
         local_9c.m_data._M_elems[0x11];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] =
         local_9c.m_data._M_elems[0x12];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] =
         local_9c.m_data._M_elems[0x13];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0] =
         local_9c.m_data._M_elems[0];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1] =
         local_9c.m_data._M_elems[1];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2] =
         local_9c.m_data._M_elems[2];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3] =
         local_9c.m_data._M_elems[3];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4] =
         local_9c.m_data._M_elems[4];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5] =
         local_9c.m_data._M_elems[5];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6] =
         local_9c.m_data._M_elems[6];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7] =
         local_9c.m_data._M_elems[7];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] =
         local_9c.m_data._M_elems[8];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] =
         local_9c.m_data._M_elems[9];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] =
         local_9c.m_data._M_elems[10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] =
         local_9c.m_data._M_elems[0xb];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] =
         local_9c.m_data._M_elems[0xc];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] =
         local_9c.m_data._M_elems[0xd];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] =
         local_9c.m_data._M_elems[0xe];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] =
         local_9c.m_data._M_elems[0xf];
    subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
    super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
    super__Head_base<0UL,_CScript_*,_false>._M_head_impl =
         *(__uniq_ptr_data<CScript,_std::default_delete<CScript>,_true,_true> *)
          &(script->super_CScriptBase)._union;
    (script->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
    if ((tuple<CScript_*,_std::default_delete<CScript>_>)
        subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
        super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
        super__Head_base<0UL,_CScript_*,_false>._M_head_impl ==
        (_Head_base<0UL,_CScript_*,_false>)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"missing redeemscript",
                 (allocator<char> *)&local_9c);
    }
    else {
      CScriptID::CScriptID
                ((CScriptID *)&local_9c,
                 (CScript *)
                 subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
                 super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                 super__Head_base<0UL,_CScript_*,_false>._M_head_impl);
      bVar3 = BaseHash<uint160>::operator!=
                        ((BaseHash<uint160> *)&local_9c,&id.super_BaseHash<uint160>);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"redeemScript does not match the scriptPubKey",
                   (allocator<char> *)&local_9c);
      }
      else {
        std::
        _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
        ::_M_emplace_unique<CScript&>
                  ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                    *)((script->super_CScriptBase)._union.direct + 0x10),
                   (CScript *)
                   subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t
                   .super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                   super__Head_base<0UL,_CScript_*,_false>._M_head_impl);
        RecurseImportData_abi_cxx11_
                  (__return_storage_ptr__,
                   (wallet *)
                   subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t
                   .super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                   super__Head_base<0UL,_CScript_*,_false>._M_head_impl,script,
                   (ImportData *)&DAT_00000001,script_ctx_00);
      }
    }
    goto LAB_004e004c;
  case MULTISIG:
    lVar9 = 0x20;
    for (uVar7 = 2;
        uVar7 < (ulong)(((long)solverdata.
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)solverdata.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1)
    {
      CPubKey::Set<unsigned_char_const*>
                ((CPubKey *)&id,
                 *(uchar **)
                  ((long)solverdata.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8),
                 *(uchar **)
                  ((long)&((solverdata.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar9));
      CPubKey::GetID((CKeyID *)&local_9c,(CPubKey *)&id);
      subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
      super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
      super__Head_base<0UL,_CScript_*,_false>._M_head_impl =
           (__uniq_ptr_data<CScript,_std::default_delete<CScript>,_true,_true>)
           ((ulong)subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t
                   .super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                   super__Head_base<0UL,_CScript_*,_false>._M_head_impl & 0xffffffffffffff00);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
      ::_M_emplace_unique<CKeyID,bool>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
                  *)(script + 2),(CKeyID *)&local_9c,(bool *)&subscript);
      lVar9 = lVar9 + 0x18;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&id);
    break;
  case NULL_DATA:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unspendable script",(allocator<char> *)&id);
    break;
  case WITNESS_V0_SCRIPTHASH:
    if (iVar8 == 2) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&id,"Trying to nest P2WSH inside another P2WSH",
                 (allocator<char> *)&local_9c);
      JSONRPCError(pUVar6,-5,(string *)&id);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_004e03d8;
    }
    n = ((solverdata.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
    RIPEMD160((uchar *)&local_9c,(size_t)n,
              ((solverdata.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish + -(long)n);
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] =
         local_9c.m_data._M_elems[0x10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] =
         local_9c.m_data._M_elems[0x11];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] =
         local_9c.m_data._M_elems[0x12];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] =
         local_9c.m_data._M_elems[0x13];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0] =
         local_9c.m_data._M_elems[0];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1] =
         local_9c.m_data._M_elems[1];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2] =
         local_9c.m_data._M_elems[2];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3] =
         local_9c.m_data._M_elems[3];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4] =
         local_9c.m_data._M_elems[4];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5] =
         local_9c.m_data._M_elems[5];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6] =
         local_9c.m_data._M_elems[6];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7] =
         local_9c.m_data._M_elems[7];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] =
         local_9c.m_data._M_elems[8];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] =
         local_9c.m_data._M_elems[9];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] =
         local_9c.m_data._M_elems[10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] =
         local_9c.m_data._M_elems[0xb];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] =
         local_9c.m_data._M_elems[0xc];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] =
         local_9c.m_data._M_elems[0xd];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] =
         local_9c.m_data._M_elems[0xe];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] =
         local_9c.m_data._M_elems[0xf];
    subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
    super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
    super__Head_base<0UL,_CScript_*,_false>._M_head_impl =
         *(__uniq_ptr_data<CScript,_std::default_delete<CScript>,_true,_true> *)
          &((_Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_> *)
           ((long)&(script->super_CScriptBase)._union + 8))->super__Head_base<0UL,_CScript_*,_false>
    ;
    *(undefined8 *)((long)&(script->super_CScriptBase)._union + 8) = 0;
    if ((tuple<CScript_*,_std::default_delete<CScript>_>)
        subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
        super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
        super__Head_base<0UL,_CScript_*,_false>._M_head_impl ==
        (_Head_base<0UL,_CScript_*,_false>)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"missing witnessscript",
                 (allocator<char> *)&local_9c);
    }
    else {
      CScriptID::CScriptID
                ((CScriptID *)&local_9c,
                 (CScript *)
                 subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
                 super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                 super__Head_base<0UL,_CScript_*,_false>._M_head_impl);
      bVar3 = BaseHash<uint160>::operator!=
                        ((BaseHash<uint160> *)&local_9c,&id.super_BaseHash<uint160>);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,
                   "witnessScript does not match the scriptPubKey or redeemScript",
                   (allocator<char> *)&local_9c);
      }
      else {
        if (iVar8 == 0) {
          std::
          _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
          ::_M_emplace_unique<CScript_const&>
                    ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                      *)((script->super_CScriptBase)._union.direct + 0x10),(CScript *)this);
        }
        std::
        _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
        ::_M_emplace_unique<CScript&>
                  ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                    *)((script->super_CScriptBase)._union.direct + 0x10),
                   (CScript *)
                   subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t
                   .super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                   super__Head_base<0UL,_CScript_*,_false>._M_head_impl);
        RecurseImportData_abi_cxx11_
                  (__return_storage_ptr__,
                   (wallet *)
                   subscript._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t
                   .super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
                   super__Head_base<0UL,_CScript_*,_false>._M_head_impl,script,(ImportData *)0x2,
                   script_ctx);
      }
    }
LAB_004e004c:
    std::unique_ptr<CScript,_std::default_delete<CScript>_>::~unique_ptr(&subscript);
    break;
  case WITNESS_V0_KEYHASH:
    if (iVar8 == 2) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&id,"Trying to nest P2WPKH inside P2WSH",(allocator<char> *)&local_9c);
      JSONRPCError(pUVar6,-5,(string *)&id);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_004e03d8;
    }
    puVar2 = ((solverdata.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch_01.m_size =
         (long)((solverdata.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar2;
    vch_01.m_data = puVar2;
    base_blob<160U>::base_blob(&local_9c,vch_01);
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] =
         local_9c.m_data._M_elems[0x10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] =
         local_9c.m_data._M_elems[0x11];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] =
         local_9c.m_data._M_elems[0x12];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] =
         local_9c.m_data._M_elems[0x13];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0] =
         local_9c.m_data._M_elems[0];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1] =
         local_9c.m_data._M_elems[1];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2] =
         local_9c.m_data._M_elems[2];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3] =
         local_9c.m_data._M_elems[3];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4] =
         local_9c.m_data._M_elems[4];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5] =
         local_9c.m_data._M_elems[5];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6] =
         local_9c.m_data._M_elems[6];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7] =
         local_9c.m_data._M_elems[7];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] =
         local_9c.m_data._M_elems[8];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] =
         local_9c.m_data._M_elems[9];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] =
         local_9c.m_data._M_elems[10];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] =
         local_9c.m_data._M_elems[0xb];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] =
         local_9c.m_data._M_elems[0xc];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] =
         local_9c.m_data._M_elems[0xd];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] =
         local_9c.m_data._M_elems[0xe];
    id.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] =
         local_9c.m_data._M_elems[0xf];
    pmVar5 = std::
             map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
             operator[]((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                         *)(script + 2),(key_type *)&id);
    *pmVar5 = true;
    if (iVar8 == 0) {
      std::
      _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>::
      _M_emplace_unique<CScript_const&>
                ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                  *)((script->super_CScriptBase)._union.direct + 0x10),(CScript *)this);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_9c);
    break;
  default:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func._M_str = "RecurseImportData";
    func._M_len = 0x11;
    msg._M_str = "Unreachable code reached (non-fatal)";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp"
    ;
    file._M_len = 0x5e;
    NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x394,func);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_004e03d8;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&solverdata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
LAB_004e03d8:
  __stack_chk_fail();
}

Assistant:

static std::string RecurseImportData(const CScript& script, ImportData& import_data, const ScriptContext script_ctx)
{
    // Use Solver to obtain script type and parsed pubkeys or hashes:
    std::vector<std::vector<unsigned char>> solverdata;
    TxoutType script_type = Solver(script, solverdata);

    switch (script_type) {
    case TxoutType::PUBKEY: {
        CPubKey pubkey(solverdata[0]);
        import_data.used_keys.emplace(pubkey.GetID(), false);
        return "";
    }
    case TxoutType::PUBKEYHASH: {
        CKeyID id = CKeyID(uint160(solverdata[0]));
        import_data.used_keys[id] = true;
        return "";
    }
    case TxoutType::SCRIPTHASH: {
        if (script_ctx == ScriptContext::P2SH) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2SH inside another P2SH");
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2SH inside a P2WSH");
        CHECK_NONFATAL(script_ctx == ScriptContext::TOP);
        CScriptID id = CScriptID(uint160(solverdata[0]));
        auto subscript = std::move(import_data.redeemscript); // Remove redeemscript from import_data to check for superfluous script later.
        if (!subscript) return "missing redeemscript";
        if (CScriptID(*subscript) != id) return "redeemScript does not match the scriptPubKey";
        import_data.import_scripts.emplace(*subscript);
        return RecurseImportData(*subscript, import_data, ScriptContext::P2SH);
    }
    case TxoutType::MULTISIG: {
        for (size_t i = 1; i + 1< solverdata.size(); ++i) {
            CPubKey pubkey(solverdata[i]);
            import_data.used_keys.emplace(pubkey.GetID(), false);
        }
        return "";
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH: {
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2WSH inside another P2WSH");
        CScriptID id{RIPEMD160(solverdata[0])};
        auto subscript = std::move(import_data.witnessscript); // Remove redeemscript from import_data to check for superfluous script later.
        if (!subscript) return "missing witnessscript";
        if (CScriptID(*subscript) != id) return "witnessScript does not match the scriptPubKey or redeemScript";
        if (script_ctx == ScriptContext::TOP) {
            import_data.import_scripts.emplace(script); // Special rule for IsMine: native P2WSH requires the TOP script imported (see script/ismine.cpp)
        }
        import_data.import_scripts.emplace(*subscript);
        return RecurseImportData(*subscript, import_data, ScriptContext::WITNESS_V0);
    }
    case TxoutType::WITNESS_V0_KEYHASH: {
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2WPKH inside P2WSH");
        CKeyID id = CKeyID(uint160(solverdata[0]));
        import_data.used_keys[id] = true;
        if (script_ctx == ScriptContext::TOP) {
            import_data.import_scripts.emplace(script); // Special rule for IsMine: native P2WPKH requires the TOP script imported (see script/ismine.cpp)
        }
        return "";
    }
    case TxoutType::NULL_DATA:
        return "unspendable script";
    case TxoutType::NONSTANDARD:
    case TxoutType::WITNESS_UNKNOWN:
    case TxoutType::WITNESS_V1_TAPROOT:
    case TxoutType::ANCHOR:
        return "unrecognized script";
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}